

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O1

void PrepareListLine(char *buffer,aint hexadd)

{
  uint uVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar6 = (ulong)IncludeLevel;
  uVar5 = ((long)sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar5 < uVar6 || uVar5 - uVar6 == 0) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  uVar1 = sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6].line;
  uVar7 = uVar1 % 10000;
  uVar9 = 0x20;
  uVar8 = reglenwidth;
  uVar3 = uVar7;
  if (4 < reglenwidth) {
    uVar9 = 0x4e;
    if (uVar1 / 10000 < 0x4e) {
      uVar9 = uVar1 / 10000;
    }
    uVar9 = uVar9 + 0x30;
    uVar3 = uVar7 + 10000;
    if (uVar1 < 10000) {
      uVar3 = uVar7;
    }
    uVar8 = 5;
  }
  builtin_strncpy(buffer,"                        ",0x18);
  if (listmacro != 0) {
    buffer[0x17] = '>';
  }
  if (DAT_0018d510 == 2) {
    buffer[0x17] = '{';
  }
  snprintf(buffer,0x800,"%*u",(ulong)uVar8,(ulong)uVar3);
  buffer[(int)uVar8] = ' ';
  iVar4 = 6 - uVar8;
  if (IncludeLevel < (int)(6 - uVar8)) {
    iVar4 = IncludeLevel;
  }
  memcpy(buffer + (int)uVar8,"++++++",(long)iVar4);
  snprintf(buffer + 6,0x800,"%04X",(ulong)(uint)hexadd & 0xffff);
  buffer[10] = ' ';
  if (0x30 < uVar9) {
    *buffer = (char)uVar9;
  }
  if (*substitutedLine == '\0') {
    substitutedLine = line;
  }
  pcVar2 = substitutedLine;
  strcpy(buffer + 0x18,substitutedLine);
  if (eolComment != (char *)0x0 && pcVar2 != line) {
    strncat(buffer,eolComment,0x1000);
    return;
  }
  return;
}

Assistant:

void PrepareListLine(char* buffer, aint hexadd)
{
	////////////////////////////////////////////////////
	// Line numbers to 1 to 99999 are supported only  //
	// For more lines, then first char is incremented //
	////////////////////////////////////////////////////

	int digit = ' ';
	int linewidth = reglenwidth;
	uint32_t currentLine = sourcePosStack.at(IncludeLevel).line;
	aint linenumber = currentLine % 10000;
	if (5 <= linewidth) {		// five-digit number, calculate the leading "digit"
		linewidth = 5;
		digit = currentLine / 10000 + '0';
		if (digit > '~') digit = '~';
		if (currentLine >= 10000) linenumber += 10000;
	}
	memset(buffer, ' ', 24);
	if (listmacro) buffer[23] = '>';
	if (Options::LST_T_MC_ONLY == Options::syx.ListingType) buffer[23] = '{';
	SPRINTF2(buffer, LINEMAX, "%*u", linewidth, linenumber); buffer[linewidth] = ' ';
	memcpy(buffer + linewidth, "++++++", IncludeLevel > 6 - linewidth ? 6 - linewidth : IncludeLevel);
	SPRINTF1(buffer + 6, LINEMAX, "%04X", hexadd & 0xFFFF); buffer[10] = ' ';
	if (digit > '0') *buffer = digit & 0xFF;
	// if substitutedLine is completely empty, list rather source line any way
	if (!*substitutedLine) substitutedLine = line;
	STRCPY(buffer + 24, LINEMAX2-24, substitutedLine);
	// add EOL comment if substituted was used and EOL comment is available
	if (substitutedLine != line && eolComment) STRCAT(buffer, LINEMAX2, eolComment);
}